

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void av1_highbd_inv_txfm2d_add_universe_sse4_1
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob,
               int bd)

{
  int8_t *piVar1;
  cfl_predict_hbd_fn p_Var2;
  cfl_predict_hbd_fn p_Var3;
  code *pcVar4;
  code *pcVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  int iVar25;
  undefined7 in_register_00000009;
  __m128i *palVar26;
  ulong uVar27;
  __m128i *palVar28;
  int iVar29;
  uint uVar30;
  __m128i *palVar31;
  int iVar32;
  long lVar33;
  byte bVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  int iVar38;
  undefined7 in_register_00000081;
  uint16_t *puVar39;
  int iVar40;
  ulong uVar41;
  uint16_t *puVar42;
  int iVar43;
  uint uVar44;
  bool bVar45;
  int local_44b0;
  uint local_44a8;
  uint local_44a0;
  int local_4464;
  int local_4460;
  undefined8 local_4438;
  undefined4 auStack_4430 [254];
  __m128i buf1 [1024];
  
  uVar36 = CONCAT71(in_register_00000081,tx_size);
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    local_4460 = 0;
    uVar44 = 0;
    iVar43 = 0;
    if (eob != 1) {
      uVar44 = (int)av1_eob_to_eobxy_default[tx_size]
                    [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + tx_size) & 0x1f)] & 0xff;
      iVar43 = (int)av1_eob_to_eobxy_default[tx_size]
                    [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + tx_size) & 0x1f)] >> 8;
    }
    piVar1 = av1_inv_txfm_shift_ls[tx_size];
    iVar23 = tx_size_wide_log2[tx_size];
    iVar40 = tx_size_high_log2[tx_size];
    iVar25 = tx_size_wide[tx_size];
    iVar32 = tx_size_high[tx_size];
    lVar33 = (long)iVar32;
    uVar30 = iVar25 >> 2;
    local_44a0 = uVar44 & 0xfffffff8;
    iVar29 = 0x20;
    if (iVar32 < 0x20) {
      iVar29 = iVar32;
    }
    iVar22 = get_rect_tx_log_ratio(iVar25,iVar32);
    bVar45 = true;
    switch(tx_type) {
    case '\x04':
    case '\b':
      local_4460 = 1;
      break;
    case '\x05':
    case '\a':
      local_4460 = 0;
      goto LAB_0037e7bb;
    case '\x06':
      local_4460 = 1;
LAB_0037e7bb:
      bVar45 = false;
    }
    puVar42 = (uint16_t *)((long)output * 2);
    iVar38 = local_44a0 + 8;
    pcVar4 = *(code **)((ulong)""[tx_type] * 0x20 + (long)iVar23 * 0x60 + 0x555830 +
                       (long)lowbd_txfm_all_1d_zeros_idx[uVar44] * 8);
    uVar44 = iVar43 + 8 >> 2 & 0xfffffffe;
    uVar36 = 0;
    uVar37 = 0;
    if (0 < (int)uVar30) {
      uVar37 = (ulong)uVar30;
    }
    pcVar5 = *(code **)((ulong)""[tx_type] * 0x20 + (long)iVar40 * 0x60 + 0x555830 +
                       (long)lowbd_txfm_all_1d_zeros_idx[iVar43] * 8);
    uVar41 = (ulong)uVar44;
    if ((int)uVar44 < 1) {
      uVar41 = uVar36;
    }
    palVar26 = buf1 + ((long)(int)uVar30 + -1) * lVar33 + 3;
    palVar31 = buf1 + 3;
    puVar39 = puVar42;
    while( true ) {
      iVar43 = (int)puVar39;
      if (uVar36 == uVar41) break;
      iVar23 = iVar38;
      load_buffer_32bit_input(input + uVar36 * 4,iVar29,(__m128i *)&local_4438,iVar38);
      if ((iVar22 == 1) || (iVar22 == -1)) {
        av1_round_shift_rect_array_32_sse4_1
                  ((__m128i *)&local_4438,(__m128i *)&local_4438,iVar38,iVar23,iVar43);
      }
      puVar39 = (uint16_t *)(ulong)(uint)bd;
      (*pcVar4)((__m128i *)&local_4438,(__m128i *)&local_4438,0xc,0);
      if (bVar45) {
        palVar28 = palVar31;
        for (lVar24 = 0; uVar37 << 6 != lVar24; lVar24 = lVar24 + 0x40) {
          uVar6 = *(undefined4 *)((long)auStack_4430 + lVar24 + -4);
          uVar7 = *(undefined4 *)((long)auStack_4430 + lVar24);
          uVar8 = *(undefined4 *)((long)auStack_4430 + lVar24 + 4);
          uVar9 = *(undefined4 *)((long)auStack_4430 + lVar24 + 8);
          uVar10 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0xc);
          uVar11 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x10);
          uVar12 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x14);
          uVar13 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x18);
          uVar14 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x1c);
          uVar15 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x20);
          uVar16 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x24);
          uVar17 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x28);
          uVar18 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x2c);
          uVar19 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x30);
          uVar20 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x34);
          *(undefined4 *)palVar28[-3] = *(undefined4 *)((long)&local_4438 + lVar24);
          *(undefined4 *)((long)palVar28[-3] + 4) = uVar9;
          *(undefined4 *)(palVar28[-3] + 1) = uVar13;
          *(undefined4 *)((long)palVar28[-3] + 0xc) = uVar17;
          *(undefined4 *)palVar28[-2] = uVar6;
          *(undefined4 *)((long)palVar28[-2] + 4) = uVar10;
          *(undefined4 *)(palVar28[-2] + 1) = uVar14;
          *(undefined4 *)((long)palVar28[-2] + 0xc) = uVar18;
          *(undefined4 *)palVar28[-1] = uVar7;
          *(undefined4 *)((long)palVar28[-1] + 4) = uVar11;
          *(undefined4 *)(palVar28[-1] + 1) = uVar15;
          *(undefined4 *)((long)palVar28[-1] + 0xc) = uVar19;
          *(undefined4 *)*palVar28 = uVar8;
          *(undefined4 *)((long)*palVar28 + 4) = uVar12;
          *(undefined4 *)(*palVar28 + 1) = uVar16;
          *(undefined4 *)((long)*palVar28 + 0xc) = uVar20;
          palVar28 = palVar28 + lVar33;
        }
      }
      else {
        palVar28 = palVar26;
        for (lVar24 = 0; uVar37 << 6 != lVar24; lVar24 = lVar24 + 0x40) {
          uVar6 = *(undefined4 *)((long)&local_4438 + lVar24);
          uVar7 = *(undefined4 *)((long)auStack_4430 + lVar24 + -4);
          uVar8 = *(undefined4 *)((long)auStack_4430 + lVar24);
          uVar9 = *(undefined4 *)((long)auStack_4430 + lVar24 + 4);
          uVar10 = *(undefined4 *)((long)auStack_4430 + lVar24 + 8);
          uVar11 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0xc);
          uVar12 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x10);
          uVar13 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x14);
          uVar14 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x18);
          uVar15 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x1c);
          uVar16 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x20);
          uVar17 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x24);
          uVar18 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x2c);
          uVar19 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x30);
          uVar20 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x34);
          *(undefined4 *)palVar28[-3] = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x28);
          *(undefined4 *)((long)palVar28[-3] + 4) = uVar14;
          *(undefined4 *)(palVar28[-3] + 1) = uVar10;
          *(undefined4 *)((long)palVar28[-3] + 0xc) = uVar6;
          *(undefined4 *)palVar28[-2] = uVar18;
          *(undefined4 *)((long)palVar28[-2] + 4) = uVar15;
          *(undefined4 *)(palVar28[-2] + 1) = uVar11;
          *(undefined4 *)((long)palVar28[-2] + 0xc) = uVar7;
          *(undefined4 *)palVar28[-1] = uVar19;
          *(undefined4 *)((long)palVar28[-1] + 4) = uVar16;
          *(undefined4 *)(palVar28[-1] + 1) = uVar12;
          *(undefined4 *)((long)palVar28[-1] + 0xc) = uVar8;
          *(undefined4 *)*palVar28 = uVar20;
          *(undefined4 *)((long)*palVar28 + 4) = uVar17;
          *(undefined4 *)(*palVar28 + 1) = uVar13;
          *(undefined4 *)((long)*palVar28 + 0xc) = uVar9;
          palVar28 = palVar28 + -lVar33;
        }
      }
      uVar36 = uVar36 + 1;
      palVar26 = palVar26 + 4;
      palVar31 = palVar31 + 4;
    }
    palVar31 = buf1;
    while (bVar45 = uVar37 != 0, uVar37 = uVar37 - 1, bVar45) {
      (*pcVar5)(palVar31,palVar31,0xc,1,bd,0);
      av1_round_shift_array_32_sse4_1(palVar31,palVar31,iVar32,-(int)piVar1[1]);
      palVar31 = palVar31 + lVar33;
    }
    uVar37 = 0;
    uVar36 = (ulong)(uint)(iVar25 >> 3);
    if (iVar25 >> 3 < 1) {
      uVar36 = uVar37;
    }
    while (uVar36 != 0) {
      highbd_write_buffer_8xn_sse4_1(buf1 + (int)uVar37,puVar42,stride,local_4460,iVar32,bd);
      puVar42 = puVar42 + 8;
      uVar37 = (ulong)(uint)((int)uVar37 + iVar32 * 2);
      uVar36 = uVar36 - 1;
    }
    break;
  case 9:
    puVar42 = (uint16_t *)((long)output * 2);
    piVar1 = av1_inv_txfm_shift_ls[tx_size];
    iVar43 = tx_size_wide_log2[tx_size];
    iVar23 = tx_size_high_log2[tx_size];
    iVar40 = tx_size_wide[tx_size];
    iVar25 = tx_size_high[tx_size];
    iVar32 = 0x20;
    if (iVar25 < 0x20) {
      iVar32 = iVar25;
    }
    iVar29 = 0x20;
    if (iVar40 < 0x20) {
      iVar29 = iVar40;
    }
    iVar22 = get_rect_tx_log_ratio(iVar40,iVar25);
    p_Var2 = cfl_get_predict_hbd_fn_ssse3::pred[(long)iVar43 * 0xc + 0x12];
    p_Var3 = cfl_get_predict_hbd_fn_ssse3::pred[(long)iVar23 * 0xc + 0x12];
    uVar41 = 0;
    uVar37 = (ulong)(uint)(iVar29 >> 2);
    if (iVar29 >> 2 < 1) {
      uVar37 = uVar41;
    }
    uVar27 = (ulong)(uint)(iVar32 >> 2);
    if (iVar32 >> 2 < 1) {
      uVar27 = uVar41;
    }
    palVar31 = buf1 + 3;
    while( true ) {
      iVar43 = (int)uVar36;
      if (uVar41 == uVar27) break;
      iVar23 = iVar29;
      load_buffer_32bit_input(input + uVar41 * 4,iVar32,(__m128i *)&local_4438,iVar29);
      if ((iVar22 == 1) || (iVar22 == -1)) {
        av1_round_shift_rect_array_32_sse4_1
                  ((__m128i *)&local_4438,(__m128i *)&local_4438,iVar29,iVar23,iVar43);
      }
      uVar36 = (ulong)(uint)bd;
      (*p_Var2)((int16_t *)&local_4438,(uint16_t *)&local_4438,0xc,0,bd);
      palVar26 = palVar31;
      for (lVar33 = 0; uVar37 << 6 != lVar33; lVar33 = lVar33 + 0x40) {
        uVar6 = *(undefined4 *)((long)&local_4438 + lVar33);
        uVar7 = *(undefined4 *)((long)auStack_4430 + lVar33 + -4);
        uVar8 = *(undefined4 *)((long)auStack_4430 + lVar33);
        uVar9 = *(undefined4 *)((long)auStack_4430 + lVar33 + 4);
        uVar10 = *(undefined4 *)((long)auStack_4430 + lVar33 + 8);
        uVar11 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0xc);
        uVar12 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x10);
        uVar13 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x14);
        uVar14 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x18);
        uVar15 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x1c);
        uVar16 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x20);
        uVar17 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x24);
        uVar18 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x28);
        uVar19 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x2c);
        uVar20 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x30);
        uVar21 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x34);
        *(undefined4 *)((long)&local_4438 + lVar33) = uVar6;
        *(undefined4 *)((long)auStack_4430 + lVar33 + -4) = uVar10;
        *(undefined4 *)((long)auStack_4430 + lVar33) = uVar14;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 4) = uVar18;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 8) = uVar7;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0xc) = uVar11;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x10) = uVar15;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x14) = uVar19;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x18) = uVar8;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x1c) = uVar12;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x20) = uVar16;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x24) = uVar20;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x28) = uVar9;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x2c) = uVar13;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x30) = uVar17;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x34) = uVar21;
        *(undefined4 *)palVar26[-3] = uVar6;
        *(undefined4 *)((long)palVar26[-3] + 4) = uVar10;
        *(undefined4 *)(palVar26[-3] + 1) = uVar14;
        *(undefined4 *)((long)palVar26[-3] + 0xc) = uVar18;
        *(undefined4 *)palVar26[-2] = uVar7;
        *(undefined4 *)((long)palVar26[-2] + 4) = uVar11;
        *(undefined4 *)(palVar26[-2] + 1) = uVar15;
        *(undefined4 *)((long)palVar26[-2] + 0xc) = uVar19;
        *(undefined4 *)palVar26[-1] = uVar8;
        *(undefined4 *)((long)palVar26[-1] + 4) = uVar12;
        *(undefined4 *)(palVar26[-1] + 1) = uVar16;
        *(undefined4 *)((long)palVar26[-1] + 0xc) = uVar20;
        *(undefined4 *)*palVar26 = uVar9;
        *(undefined4 *)((long)*palVar26 + 4) = uVar13;
        *(undefined4 *)(*palVar26 + 1) = uVar17;
        *(undefined4 *)((long)*palVar26 + 0xc) = uVar21;
        palVar26 = palVar26 + iVar25;
      }
      uVar41 = uVar41 + 1;
      palVar31 = palVar31 + 4;
    }
    palVar31 = buf1;
    while (bVar45 = uVar37 != 0, uVar37 = uVar37 - 1, bVar45) {
      (*p_Var3)((int16_t *)palVar31,(uint16_t *)palVar31,0xc,1,bd);
      av1_round_shift_array_32_sse4_1(palVar31,palVar31,iVar25,-(int)piVar1[1]);
      palVar31 = palVar31 + iVar25;
    }
    uVar37 = 0;
    uVar36 = (ulong)(uint)(iVar40 >> 3);
    if (iVar40 >> 3 < 1) {
      uVar36 = uVar37;
    }
    while (uVar36 != 0) {
      highbd_write_buffer_8xn_sse4_1(buf1 + (int)uVar37,puVar42,stride,0,iVar25,bd);
      puVar42 = puVar42 + 8;
      uVar37 = (ulong)(uint)((int)uVar37 + iVar25 * 2);
      uVar36 = uVar36 - 1;
    }
    break;
  case 10:
  case 0xc:
  case 0xe:
    iVar43 = tx_size_high[tx_size];
    uVar36 = 0x20;
    iVar23 = 0x20;
    if (iVar43 < 0x20) {
      iVar23 = iVar43;
    }
    if (eob < iVar23) {
      iVar40 = *(int *)(&DAT_004c205c + (long)eob * 4);
    }
    else {
      iVar40 = iVar23 + -1;
    }
    piVar1 = av1_inv_txfm_shift_ls[tx_size];
    iVar25 = tx_size_wide_log2[tx_size];
    iVar32 = tx_size_high_log2[tx_size];
    uVar44 = tx_size_wide[tx_size];
    if ((int)uVar44 < 0x20) {
      uVar36 = (ulong)uVar44;
    }
    iVar38 = (int)uVar36;
    iVar22 = get_rect_tx_log_ratio(uVar44,iVar43);
    bVar34 = (byte)(tx_type - 4) >> 1 | tx_type * -0x80;
    uVar37 = 0;
    iVar29 = 0;
    if (bVar34 < 6) {
      iVar29 = *(int *)(&DAT_004c20e0 + (ulong)bVar34 * 4);
    }
    puVar42 = (uint16_t *)((long)output * 2);
    uVar35 = iVar40 + 8 >> 2 & 0xfffffffe;
    uVar30 = iVar38 >> 2;
    if (iVar38 >> 2 < 1) {
      uVar30 = 0;
    }
    uVar41 = (ulong)uVar30;
    pcVar4 = *(code **)((ulong)""[tx_type] * 0x20 + (long)iVar25 * 0x60 + 0x555830);
    if ((int)uVar35 < 1) {
      uVar35 = 0;
    }
    pcVar5 = *(code **)((ulong)""[tx_type] * 0x20 + (long)iVar32 * 0x60 + 0x555830 +
                       (long)lowbd_txfm_all_1d_zeros_idx[iVar40] * 8);
    palVar31 = buf1 + 3;
    for (; iVar40 = (int)uVar36, uVar37 != uVar35; uVar37 = uVar37 + 1) {
      iVar25 = iVar38;
      load_buffer_32bit_input(input + uVar37 * 4,iVar23,(__m128i *)&local_4438,iVar38);
      if ((iVar22 == 1) || (iVar22 == -1)) {
        av1_round_shift_rect_array_32_sse4_1
                  ((__m128i *)&local_4438,(__m128i *)&local_4438,iVar38,iVar25,iVar40);
      }
      uVar36 = (ulong)(uint)bd;
      (*pcVar4)((__m128i *)&local_4438,(__m128i *)&local_4438,0xc,0);
      palVar26 = palVar31;
      for (lVar33 = 0; uVar41 << 6 != lVar33; lVar33 = lVar33 + 0x40) {
        uVar6 = *(undefined4 *)((long)&local_4438 + lVar33);
        uVar7 = *(undefined4 *)((long)auStack_4430 + lVar33 + -4);
        uVar8 = *(undefined4 *)((long)auStack_4430 + lVar33);
        uVar9 = *(undefined4 *)((long)auStack_4430 + lVar33 + 4);
        uVar10 = *(undefined4 *)((long)auStack_4430 + lVar33 + 8);
        uVar11 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0xc);
        uVar12 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x10);
        uVar13 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x14);
        uVar14 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x18);
        uVar15 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x1c);
        uVar16 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x20);
        uVar17 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x24);
        uVar18 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x28);
        uVar19 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x2c);
        uVar20 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x30);
        uVar21 = *(undefined4 *)((long)auStack_4430 + lVar33 + 0x34);
        *(undefined4 *)((long)&local_4438 + lVar33) = uVar6;
        *(undefined4 *)((long)auStack_4430 + lVar33 + -4) = uVar10;
        *(undefined4 *)((long)auStack_4430 + lVar33) = uVar14;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 4) = uVar18;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 8) = uVar7;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0xc) = uVar11;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x10) = uVar15;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x14) = uVar19;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x18) = uVar8;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x1c) = uVar12;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x20) = uVar16;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x24) = uVar20;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x28) = uVar9;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x2c) = uVar13;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x30) = uVar17;
        *(undefined4 *)((long)auStack_4430 + lVar33 + 0x34) = uVar21;
        *(undefined4 *)palVar26[-3] = uVar6;
        *(undefined4 *)((long)palVar26[-3] + 4) = uVar10;
        *(undefined4 *)(palVar26[-3] + 1) = uVar14;
        *(undefined4 *)((long)palVar26[-3] + 0xc) = uVar18;
        *(undefined4 *)palVar26[-2] = uVar7;
        *(undefined4 *)((long)palVar26[-2] + 4) = uVar11;
        *(undefined4 *)(palVar26[-2] + 1) = uVar15;
        *(undefined4 *)((long)palVar26[-2] + 0xc) = uVar19;
        *(undefined4 *)palVar26[-1] = uVar8;
        *(undefined4 *)((long)palVar26[-1] + 4) = uVar12;
        *(undefined4 *)(palVar26[-1] + 1) = uVar16;
        *(undefined4 *)((long)palVar26[-1] + 0xc) = uVar20;
        *(undefined4 *)*palVar26 = uVar9;
        *(undefined4 *)((long)*palVar26 + 4) = uVar13;
        *(undefined4 *)(*palVar26 + 1) = uVar17;
        *(undefined4 *)((long)*palVar26 + 0xc) = uVar21;
        palVar26 = palVar26 + iVar43;
      }
      palVar31 = palVar31 + 4;
    }
    palVar31 = buf1;
    while (bVar45 = uVar41 != 0, uVar41 = uVar41 - 1, bVar45) {
      (*pcVar5)(palVar31,palVar31,0xc,1,bd,0);
      av1_round_shift_array_32_sse4_1(palVar31,palVar31,iVar43,-(int)piVar1[1]);
      palVar31 = palVar31 + iVar43;
    }
    uVar37 = 0;
    uVar36 = (ulong)(uint)((int)uVar44 >> 3);
    if ((int)uVar44 >> 3 < 1) {
      uVar36 = uVar37;
    }
    while (uVar36 != 0) {
      highbd_write_buffer_8xn_sse4_1(buf1 + (int)uVar37,puVar42,stride,iVar29,iVar43,bd);
      puVar42 = puVar42 + 8;
      uVar37 = (ulong)(uint)((int)uVar37 + iVar43 * 2);
      uVar36 = uVar36 - 1;
    }
    break;
  case 0xb:
  case 0xd:
  case 0xf:
    iVar43 = tx_size_wide[tx_size];
    iVar23 = 0x20;
    if (iVar43 < 0x20) {
      iVar23 = iVar43;
    }
    if (eob < iVar23) {
      uVar44 = *(uint *)(&DAT_004c205c + (long)eob * 4);
    }
    else {
      uVar44 = iVar23 - 1;
    }
    piVar1 = av1_inv_txfm_shift_ls[tx_size];
    iVar40 = tx_size_wide_log2[tx_size];
    iVar25 = tx_size_high_log2[tx_size];
    iVar32 = tx_size_high[tx_size];
    lVar33 = (long)iVar32;
    uVar30 = iVar23 >> 2;
    local_44b0 = 0x20;
    if (iVar32 < 0x20) {
      local_44b0 = iVar32;
    }
    local_44a8 = uVar44 & 0xfffffff8;
    iVar23 = get_rect_tx_log_ratio(iVar43,iVar32);
    if (tx_type == '\x0f') {
      local_4464 = 0;
      bVar45 = false;
    }
    else {
      bVar45 = true;
      local_4464 = 0;
      if (tx_type == '\x0e') {
        local_4464 = 1;
      }
    }
    puVar42 = (uint16_t *)((long)output * 2);
    iVar29 = local_44a8 + 8;
    pcVar4 = *(code **)((ulong)""[tx_type] * 0x20 + (long)iVar40 * 0x60 + 0x555830 +
                       (long)lowbd_txfm_all_1d_zeros_idx[(int)uVar44] * 8);
    uVar37 = 0;
    uVar41 = 0;
    if (0 < (int)uVar30) {
      uVar41 = (ulong)uVar30;
    }
    pcVar5 = *(code **)((ulong)""[tx_type] * 0x20 + (long)iVar25 * 0x60 + 0x555830);
    uVar27 = (ulong)(uint)(local_44b0 >> 2);
    if (local_44b0 >> 2 < 1) {
      uVar27 = uVar37;
    }
    palVar26 = buf1 + ((long)(int)uVar30 + -1) * lVar33 + 3;
    palVar31 = buf1 + 3;
    for (; iVar40 = (int)uVar36, uVar37 != uVar27; uVar37 = uVar37 + 1) {
      iVar25 = iVar29;
      load_buffer_32bit_input(input + uVar37 * 4,local_44b0,(__m128i *)&local_4438,iVar29);
      if ((iVar23 == 1) || (iVar23 == -1)) {
        av1_round_shift_rect_array_32_sse4_1
                  ((__m128i *)&local_4438,(__m128i *)&local_4438,iVar29,iVar25,iVar40);
      }
      uVar36 = (ulong)(uint)bd;
      (*pcVar4)((__m128i *)&local_4438,(__m128i *)&local_4438,0xc,0);
      if (bVar45) {
        palVar28 = palVar31;
        for (lVar24 = 0; uVar41 << 6 != lVar24; lVar24 = lVar24 + 0x40) {
          uVar6 = *(undefined4 *)((long)auStack_4430 + lVar24 + -4);
          uVar7 = *(undefined4 *)((long)auStack_4430 + lVar24);
          uVar8 = *(undefined4 *)((long)auStack_4430 + lVar24 + 4);
          uVar9 = *(undefined4 *)((long)auStack_4430 + lVar24 + 8);
          uVar10 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0xc);
          uVar11 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x10);
          uVar12 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x14);
          uVar13 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x18);
          uVar14 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x1c);
          uVar15 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x20);
          uVar16 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x24);
          uVar17 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x28);
          uVar18 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x2c);
          uVar19 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x30);
          uVar20 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x34);
          *(undefined4 *)palVar28[-3] = *(undefined4 *)((long)&local_4438 + lVar24);
          *(undefined4 *)((long)palVar28[-3] + 4) = uVar9;
          *(undefined4 *)(palVar28[-3] + 1) = uVar13;
          *(undefined4 *)((long)palVar28[-3] + 0xc) = uVar17;
          *(undefined4 *)palVar28[-2] = uVar6;
          *(undefined4 *)((long)palVar28[-2] + 4) = uVar10;
          *(undefined4 *)(palVar28[-2] + 1) = uVar14;
          *(undefined4 *)((long)palVar28[-2] + 0xc) = uVar18;
          *(undefined4 *)palVar28[-1] = uVar7;
          *(undefined4 *)((long)palVar28[-1] + 4) = uVar11;
          *(undefined4 *)(palVar28[-1] + 1) = uVar15;
          *(undefined4 *)((long)palVar28[-1] + 0xc) = uVar19;
          *(undefined4 *)*palVar28 = uVar8;
          *(undefined4 *)((long)*palVar28 + 4) = uVar12;
          *(undefined4 *)(*palVar28 + 1) = uVar16;
          *(undefined4 *)((long)*palVar28 + 0xc) = uVar20;
          palVar28 = palVar28 + lVar33;
        }
      }
      else {
        palVar28 = palVar26;
        for (lVar24 = 0; uVar41 << 6 != lVar24; lVar24 = lVar24 + 0x40) {
          uVar6 = *(undefined4 *)((long)&local_4438 + lVar24);
          uVar7 = *(undefined4 *)((long)auStack_4430 + lVar24 + -4);
          uVar8 = *(undefined4 *)((long)auStack_4430 + lVar24);
          uVar9 = *(undefined4 *)((long)auStack_4430 + lVar24 + 4);
          uVar10 = *(undefined4 *)((long)auStack_4430 + lVar24 + 8);
          uVar11 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0xc);
          uVar12 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x10);
          uVar13 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x14);
          uVar14 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x18);
          uVar15 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x1c);
          uVar16 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x20);
          uVar17 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x24);
          uVar18 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x2c);
          uVar19 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x30);
          uVar20 = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x34);
          *(undefined4 *)palVar28[-3] = *(undefined4 *)((long)auStack_4430 + lVar24 + 0x28);
          *(undefined4 *)((long)palVar28[-3] + 4) = uVar14;
          *(undefined4 *)(palVar28[-3] + 1) = uVar10;
          *(undefined4 *)((long)palVar28[-3] + 0xc) = uVar6;
          *(undefined4 *)palVar28[-2] = uVar18;
          *(undefined4 *)((long)palVar28[-2] + 4) = uVar15;
          *(undefined4 *)(palVar28[-2] + 1) = uVar11;
          *(undefined4 *)((long)palVar28[-2] + 0xc) = uVar7;
          *(undefined4 *)palVar28[-1] = uVar19;
          *(undefined4 *)((long)palVar28[-1] + 4) = uVar16;
          *(undefined4 *)(palVar28[-1] + 1) = uVar12;
          *(undefined4 *)((long)palVar28[-1] + 0xc) = uVar8;
          *(undefined4 *)*palVar28 = uVar20;
          *(undefined4 *)((long)*palVar28 + 4) = uVar17;
          *(undefined4 *)(*palVar28 + 1) = uVar13;
          *(undefined4 *)((long)*palVar28 + 0xc) = uVar9;
          palVar28 = palVar28 + -lVar33;
        }
      }
      palVar26 = palVar26 + 4;
      palVar31 = palVar31 + 4;
    }
    palVar31 = buf1;
    while (bVar45 = uVar41 != 0, uVar41 = uVar41 - 1, bVar45) {
      (*pcVar5)(palVar31,palVar31,0xc,1,bd,0);
      av1_round_shift_array_32_sse4_1(palVar31,palVar31,iVar32,-(int)piVar1[1]);
      palVar31 = palVar31 + lVar33;
    }
    uVar37 = 0;
    uVar36 = (ulong)(uint)(iVar43 >> 3);
    if (iVar43 >> 3 < 1) {
      uVar36 = uVar37;
    }
    while (uVar36 != 0) {
      highbd_write_buffer_8xn_sse4_1(buf1 + (int)uVar37,puVar42,stride,local_4464,iVar32,bd);
      puVar42 = puVar42 + 8;
      uVar37 = (ulong)(uint)((int)uVar37 + iVar32 * 2);
      uVar36 = uVar36 - 1;
    }
  }
  return;
}

Assistant:

void av1_highbd_inv_txfm2d_add_universe_sse4_1(const int32_t *input,
                                               uint8_t *output, int stride,
                                               TX_TYPE tx_type, TX_SIZE tx_size,
                                               int eob, const int bd) {
  switch (tx_type) {
    case DCT_DCT:
    case ADST_DCT:
    case DCT_ADST:
    case ADST_ADST:
    case FLIPADST_DCT:
    case DCT_FLIPADST:
    case FLIPADST_FLIPADST:
    case ADST_FLIPADST:
    case FLIPADST_ADST:
      highbd_inv_txfm2d_add_no_identity_sse41(
          input, CONVERT_TO_SHORTPTR(output), stride, tx_type, tx_size, eob,
          bd);
      break;
    case V_DCT:
    case V_ADST:
    case V_FLIPADST:
      highbd_inv_txfm2d_add_h_identity_ssse41(
          input, CONVERT_TO_SHORTPTR(output), stride, tx_type, tx_size, eob,
          bd);
      break;
    case H_DCT:
    case H_ADST:
    case H_FLIPADST:
      highbd_inv_txfm2d_add_v_identity_ssse41(
          input, CONVERT_TO_SHORTPTR(output), stride, tx_type, tx_size, eob,
          bd);
      break;
    case IDTX:
      highbd_inv_txfm2d_add_idtx_ssse41(input, CONVERT_TO_SHORTPTR(output),
                                        stride, tx_type, tx_size, eob, bd);
      break;
    default: assert(0); break;
  }
}